

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O2

void __thiscall QComboBoxPrivateScroller::~QComboBoxPrivateScroller(QComboBoxPrivateScroller *this)

{
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007ca4e8;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice =
       &PTR__QComboBoxPrivateScroller_007ca698;
  QBasicTimer::~QBasicTimer(&this->timer);
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QComboBoxPrivateScroller : public QWidget
{
    Q_OBJECT

public:
    QComboBoxPrivateScroller(QAbstractSlider::SliderAction action, QWidget *parent)
        : QWidget(parent), sliderAction(action)
    {
        setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed);
        setAttribute(Qt::WA_NoMousePropagation);
    }